

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall cmExtraCodeLiteGenerator::Generate(cmExtraCodeLiteGenerator *this)

{
  cmGlobalGenerator *pcVar1;
  cmLocalGenerator *this_00;
  pointer pbVar2;
  __type _Var3;
  bool bVar4;
  string *__lhs;
  cmExtraCodeLiteGenerator *this_01;
  _Base_ptr p_Var5;
  string *it;
  pointer value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ProjectNames;
  cmXMLWriter xml;
  string workspaceOutputDir;
  string workspaceProjectName;
  string workspaceFileName;
  string workspaceSourcePath;
  cmGeneratedFileStream fout;
  allocator<char> local_3b1;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  undefined1 local_370 [88];
  pointer local_318;
  pointer local_310;
  undefined1 local_308 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  cmExtraCodeLiteGenerator *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [616];
  
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_318 = (pointer)local_308;
  local_310 = (pointer)0x0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  this_01 = (cmExtraCodeLiteGenerator *)local_2a8;
  local_2b0 = 0;
  local_308[0] = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_2a8[0] = 0;
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var5 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_390 = &this->ConfigName;
  local_2b8 = this_01;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
LAB_0029c408:
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_298,&local_2d8,false,None);
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_370,(ostream *)local_298,0);
      cmXMLWriter::StartDocument((cmXMLWriter *)local_370,"utf-8");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"CodeLite_Workspace",(allocator<char> *)&local_388);
      cmXMLWriter::StartElement((cmXMLWriter *)local_370,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_370,"Name",&local_2f8);
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"CMAKE_CODELITE_USE_TARGETS",(allocator<char> *)&local_388);
      bVar4 = cmGlobalGenerator::GlobalSettingIsOn(pcVar1,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bVar4) {
        CreateProjectsByTarget_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_3b0,this,(cmXMLWriter *)local_370);
      }
      else {
        CreateProjectsByProjectMaps_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_3b0,this,(cmXMLWriter *)local_370);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_388,&local_3b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"BuildMatrix",&local_3b1);
      cmXMLWriter::StartElement((cmXMLWriter *)local_370,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"WorkspaceConfiguration",&local_3b1);
      cmXMLWriter::StartElement((cmXMLWriter *)local_370,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_370,"Name",local_390);
      cmXMLWriter::Attribute<char[4]>((cmXMLWriter *)local_370,"Selected",(char (*) [4])"yes");
      pbVar2 = local_388.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (value = local_388.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; value != pbVar2; value = value + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b0,"Project",&local_3b1);
        cmXMLWriter::StartElement((cmXMLWriter *)local_370,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_370,"Name",value);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  ((cmXMLWriter *)local_370,"ConfigName",local_390);
        cmXMLWriter::EndElement((cmXMLWriter *)local_370);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_370);
      cmXMLWriter::EndElement((cmXMLWriter *)local_370);
      cmXMLWriter::EndElement((cmXMLWriter *)local_370);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388);
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_370);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f8);
      return;
    }
    this_00 = (cmLocalGenerator *)**(undefined8 **)(p_Var5 + 2);
    GetConfigurationName_abi_cxx11_((string *)local_298,this_01,this_00->Makefile);
    std::__cxx11::string::operator=((string *)local_390,(string *)local_298);
    std::__cxx11::string::~string((string *)local_298);
    __lhs = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    this_01 = (cmExtraCodeLiteGenerator *)cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
    _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this_01);
    if (_Var3) {
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      std::__cxx11::string::_M_assign((string *)&local_318);
      cmLocalGenerator::GetProjectName_abi_cxx11_((string *)local_298,this_00);
      std::__cxx11::string::operator=((string *)&local_2f8,(string *)local_298);
      std::__cxx11::string::~string((string *)local_298);
      cmLocalGenerator::GetSourceDirectory_abi_cxx11_(this_00);
      std::__cxx11::string::_M_assign((string *)&local_2b8);
      local_298._0_8_ = local_310;
      local_298._8_8_ = local_318;
      local_370._8_8_ = local_370 + 0x10;
      local_370._0_8_ = (ostream *)0x1;
      local_370[0x10] = '/';
      cmStrCat<std::__cxx11::string,char[11]>
                (&local_3b0,(cmAlphaNum *)local_298,(cmAlphaNum *)local_370,&local_2f8,
                 (char (*) [11])".workspace");
      std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      std::__cxx11::string::_M_assign((string *)&this->WorkspacePath);
      goto LAB_0029c408;
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void cmExtraCodeLiteGenerator::Generate()
{
  // Hold root tree information for creating the workspace
  std::string workspaceProjectName;
  std::string workspaceOutputDir;
  std::string workspaceFileName;
  std::string workspaceSourcePath;

  const std::map<std::string, std::vector<cmLocalGenerator*>>& projectMap =
    this->GlobalGenerator->GetProjectMap();

  // loop projects and locate the root project.
  // and extract the information for creating the worspace
  // root makefile
  for (auto const& it : projectMap) {
    cmLocalGenerator* lg = it.second[0];
    const cmMakefile* mf = lg->GetMakefile();
    this->ConfigName = this->GetConfigurationName(mf);

    if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
      workspaceOutputDir = lg->GetCurrentBinaryDirectory();
      workspaceProjectName = lg->GetProjectName();
      workspaceSourcePath = lg->GetSourceDirectory();
      workspaceFileName =
        cmStrCat(workspaceOutputDir, '/', workspaceProjectName, ".workspace");
      this->WorkspacePath = lg->GetCurrentBinaryDirectory();
      break;
    }
  }

  cmGeneratedFileStream fout(workspaceFileName);
  cmXMLWriter xml(fout);

  xml.StartDocument("utf-8");
  xml.StartElement("CodeLite_Workspace");
  xml.Attribute("Name", workspaceProjectName);

  bool const targetsAreProjects =
    this->GlobalGenerator->GlobalSettingIsOn("CMAKE_CODELITE_USE_TARGETS");

  std::vector<std::string> ProjectNames;
  if (targetsAreProjects) {
    ProjectNames = this->CreateProjectsByTarget(&xml);
  } else {
    ProjectNames = this->CreateProjectsByProjectMaps(&xml);
  }

  xml.StartElement("BuildMatrix");
  xml.StartElement("WorkspaceConfiguration");
  xml.Attribute("Name", this->ConfigName);
  xml.Attribute("Selected", "yes");

  for (std::string const& it : ProjectNames) {
    xml.StartElement("Project");
    xml.Attribute("Name", it);
    xml.Attribute("ConfigName", this->ConfigName);
    xml.EndElement();
  }

  xml.EndElement(); // WorkspaceConfiguration
  xml.EndElement(); // BuildMatrix
  xml.EndElement(); // CodeLite_Workspace
}